

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.h
# Opt level: O0

uint8_t * __thiscall
google::protobuf::internal::ExtensionSet::_InternalSerialize
          (ExtensionSet *this,MessageLite *extendee,int start_field_number,int end_field_number,
          uint8_t *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  int end_field_number_local;
  int start_field_number_local;
  MessageLite *extendee_local;
  ExtensionSet *this_local;
  
  if (this->flat_size_ == 0) {
    bVar1 = is_large(this);
    this_local = (ExtensionSet *)target;
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      __assert_fail("!is_large()",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.h"
                    ,0x1e8,
                    "uint8_t *google::protobuf::internal::ExtensionSet::_InternalSerialize(const MessageLite *, int, int, uint8_t *, io::EpsCopyOutputStream *) const"
                   );
    }
  }
  else {
    this_local = (ExtensionSet *)
                 _InternalSerializeImpl
                           (this,extendee,start_field_number,end_field_number,target,stream);
  }
  return (uint8_t *)this_local;
}

Assistant:

uint8_t* _InternalSerialize(const MessageLite* extendee,
                              int start_field_number, int end_field_number,
                              uint8_t* target,
                              io::EpsCopyOutputStream* stream) const {
    if (flat_size_ == 0) {
      assert(!is_large());
      return target;
    }
    return _InternalSerializeImpl(extendee, start_field_number,
                                  end_field_number, target, stream);
  }